

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::CallGraph::_add_new_calltree(CallGraph *this,NodeData *node_data)

{
  undefined1 local_38 [16];
  NodeData *local_18;
  NodeData *node_data_local;
  CallGraph *this_local;
  
  local_18 = node_data;
  node_data_local = (NodeData *)this;
  std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::shared_ptr
            ((shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)local_38,(nullptr_t)0x0);
  _add_new_call((CallGraph *)&stack0xffffffffffffffd8,(NodeData *)this,
                (shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)node_data,
                (vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                 *)local_38);
  std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::operator=
            (&this->_current_call,
             (shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)&stack0xffffffffffffffd8);
  std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::~shared_ptr
            ((shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)&stack0xffffffffffffffd8);
  std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::~shared_ptr
            ((shared_ptr<HawkTracer::client::CallGraph::TreeNode> *)local_38);
  return;
}

Assistant:

void CallGraph::_add_new_calltree(const NodeData& node_data)
{
    _current_call = _add_new_call(node_data, nullptr, _root_calls);
}